

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O3

void __thiscall flatbuffers::Registry::AddIncludeDirectory(Registry *this,char *path)

{
  pointer *pppcVar1;
  iterator __position;
  char *local_8;
  
  __position._M_current =
       (this->include_paths_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->include_paths_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    local_8 = path;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->include_paths_,__position,
               &local_8);
  }
  else {
    *__position._M_current = path;
    pppcVar1 = &(this->include_paths_).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void AddIncludeDirectory(const char *path) { include_paths_.push_back(path); }